

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

void __thiscall
chaiscript::exception::eval_error::eval_error
          (eval_error *this,string *t_why,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_parameters,
          vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
          *t_functions,bool t_dot_notation,Dispatch_Engine *t_ss)

{
  Dispatch_Engine *t_ss_00;
  string sStack_48;
  
  t_ss_00 = t_ss;
  format(&sStack_48,t_why,t_parameters,t_dot_notation,t_ss);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  *(undefined ***)this = &PTR__eval_error_0045e038;
  std::__cxx11::string::string((string *)&this->reason,t_why);
  (this->start_position).line = 0;
  (this->start_position).column = 0;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  format_detail_abi_cxx11_
            (&this->detail,(eval_error *)t_functions,
             (vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
              *)(ulong)t_dot_notation,SUB81(t_ss,0),t_ss_00);
  (this->call_stack).
  super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->call_stack).
  super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->call_stack).
  super__Vector_base<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

eval_error(const std::string &t_why,
                 const std::vector<Boxed_Value> &t_parameters,
                 const std::vector<chaiscript::Const_Proxy_Function> &t_functions,
                 bool t_dot_notation,
                 const chaiscript::detail::Dispatch_Engine &t_ss) noexcept
          : std::runtime_error(format(t_why, t_parameters, t_dot_notation, t_ss))
          , reason(t_why)
          , detail(format_detail(t_functions, t_dot_notation, t_ss)) {
      }